

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> pcVar1;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar2;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar3;
  type plVar4;
  type prVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar7;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  longdouble sum_a_p;
  longdouble sum_a_pi;
  int local_2c;
  int r_size;
  bit_array *x_local;
  row_iterator end_local;
  row_iterator begin_local;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *this_local;
  
  local_2c = 0;
  for (end_local = begin; end_local != end; end_local = end_local + 1) {
    unique0x00076c00 = (longdouble)0;
    lVar7 = in_ST5;
    unique0x100001c6 = unique0x00076c00;
    sparse_matrix<int>::column((sparse_matrix<int> *)&stack0xffffffffffffff98,(int)this + 0x10);
    lVar6 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar7;
    while( true ) {
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&stack0xffffffffffffff98);
      pcVar1 = *ppcVar2;
      ppcVar3 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&stack0xffffffffffffff98);
      if (pcVar1 == *ppcVar3) break;
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&stack0xffffffffffffff98);
      plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->pi,(long)(*ppcVar2)->row);
      register0x00001110 = stack0xffffffffffffffb8 + *plVar4;
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&stack0xffffffffffffff98);
      plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->P,(long)(*ppcVar2)->value);
      register0x00001110 = stack0xffffffffffffffa8 + *plVar4;
      in_ST5 = in_ST4;
      ppcVar2 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&stack0xffffffffffffff98);
      *ppcVar2 = *ppcVar2 + 1;
    }
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar5->id = local_2c;
    quadratic_cost_type<long_double>::operator()
              ((longdouble *)this->c,
               (quadratic_cost_type<long_double> *)(ulong)(uint)end_local->column,(int)x,
               (bit_array *)prVar5);
    lVar6 = (lVar6 - stack0xffffffffffffffb8) - stack0xffffffffffffffa8;
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&this->R,(long)local_2c);
    prVar5->value = lVar6;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                sum_a_pi += pi[std::get<0>(ht)->row];
                sum_a_p += P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;

            ++r_size;
        }

        return r_size;
    }